

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall QTextDocumentPrivate::contentsChanged(QTextDocumentPrivate *this)

{
  QTextDocumentPrivate *in_RDI;
  bool _t1;
  bool m;
  QTextDocument *q;
  
  q_func(in_RDI);
  if (in_RDI->editBlock == 0) {
    if ((in_RDI->undoEnabled & 1U) == 0) {
      _t1 = true;
    }
    else {
      _t1 = in_RDI->modifiedState != in_RDI->undoState;
    }
    if ((bool)(in_RDI->modified & 1U) != _t1) {
      in_RDI->modified = _t1;
      QTextDocument::modificationChanged((QTextDocument *)0x7d6297,_t1);
    }
    QTextDocument::contentsChanged((QTextDocument *)0x7d62a1);
  }
  return;
}

Assistant:

void QTextDocumentPrivate::contentsChanged()
{
    Q_Q(QTextDocument);
    if (editBlock)
        return;

    bool m = undoEnabled ? (modifiedState != undoState) : true;
    if (modified != m) {
        modified = m;
        emit q->modificationChanged(modified);
    }

    emit q->contentsChanged();
}